

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

aiMesh * __thiscall Assimp::ColladaLoader::findMesh(ColladaLoader *this,string *meshid)

{
  value_type paVar1;
  __type _Var2;
  ulong uVar3;
  size_type sVar4;
  reference ppaVar5;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  uint local_60;
  uint i_1;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  uint local_24;
  string *psStack_20;
  uint i;
  string *meshid_local;
  ColladaLoader *this_local;
  
  local_24 = 0;
  psStack_20 = meshid;
  meshid_local = (string *)this;
  while( true ) {
    uVar3 = (ulong)local_24;
    sVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->mMeshes);
    if (sVar4 <= uVar3) {
      local_60 = 0;
      while( true ) {
        uVar3 = (ulong)local_60;
        sVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->mTargetMeshes);
        if (sVar4 <= uVar3) {
          return (aiMesh *)0x0;
        }
        ppaVar5 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                            (&this->mTargetMeshes,(ulong)local_60);
        paVar1 = *ppaVar5;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,(paVar1->mName).data,&local_81);
        _Var2 = std::operator==(&local_80,psStack_20);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator(&local_81);
        if (_Var2) break;
        local_60 = local_60 + 1;
      }
      ppaVar5 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                          (&this->mTargetMeshes,(ulong)local_60);
      return *ppaVar5;
    }
    ppaVar5 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                        (&this->mMeshes,(ulong)local_24);
    paVar1 = *ppaVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,(paVar1->mName).data,&local_49);
    _Var2 = std::operator==(&local_48,psStack_20);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    if (_Var2) break;
    local_24 = local_24 + 1;
  }
  ppaVar5 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                      (&this->mMeshes,(ulong)local_24);
  return *ppaVar5;
}

Assistant:

aiMesh *ColladaLoader::findMesh(const std::string& meshid) {
    for (unsigned int i = 0; i < mMeshes.size(); ++i) {
        if (std::string(mMeshes[i]->mName.data) == meshid) {
            return mMeshes[i];
        }
    }

    for (unsigned int i = 0; i < mTargetMeshes.size(); ++i) {
        if (std::string(mTargetMeshes[i]->mName.data) == meshid) {
            return mTargetMeshes[i];
        }
    }

    return nullptr;
}